

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall Units_hasUnitsName_Test::~Units_hasUnitsName_Test(Units_hasUnitsName_Test *this)

{
  Units_hasUnitsName_Test *this_local;
  
  ~Units_hasUnitsName_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, hasUnitsName)
{
    libcellml::ModelPtr m = libcellml::Model::create();

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("a_unit");

    u->addUnit(libcellml::Units::StandardUnit::AMPERE, "micro");
    m->addUnits(u);
    EXPECT_TRUE(m->hasUnits("a_unit"));
}